

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

void __thiscall
pbrt::AnimatedTransform::FindZeros
          (AnimatedTransform *this,Float c1,Float c2,Float c3,Float c4,Float c5,Float theta,
          Interval tInterval,span<float> zeros,int *nZeros,int depth)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  Interval IVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 in_XMM6_Qb;
  undefined1 local_d8 [16];
  float local_98;
  Interval local_58;
  Interval local_50;
  Interval local_48;
  Interval local_40;
  Interval local_38;
  Interval local_30;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  local_98 = tInterval.low;
  local_30.low = c3;
  local_30.high = c3;
  auVar14._0_8_ = Interval::operator*(&local_30,tInterval);
  auVar14._8_56_ = extraout_var_01;
  fVar5 = auVar14._0_4_ + c2;
  if (-INFINITY < fVar5) {
    auVar21._0_12_ = ZEXT812(0);
    auVar21._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar5),auVar21,0);
    bVar7 = (bool)((byte)uVar2 & 1);
    fVar5 = (float)((uint)bVar7 * -0x80000000 + (uint)!bVar7 * (int)fVar5);
    fVar5 = (float)((int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2);
  }
  auVar21 = vmovshdup_avx(auVar14._0_16_);
  fVar8 = auVar21._0_4_ + c2;
  if (fVar8 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40,0);
    fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
    fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
  }
  auVar20 = vminss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar5));
  auVar21 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar5));
  auVar21 = vinsertps_avx(auVar20,auVar21,0x10);
  local_50 = (Interval)vmovlps_avx(auVar21);
  fVar5 = theta + theta;
  local_38.low = fVar5;
  local_38.high = fVar5;
  IVar13 = Interval::operator*(&local_38,tInterval);
  IVar13 = Cos(IVar13);
  auVar15._0_8_ = Interval::operator*(&local_50,IVar13);
  auVar15._8_56_ = extraout_var_02;
  fVar8 = auVar15._0_4_ + c1;
  if (-INFINITY < fVar8) {
    auVar20._0_12_ = ZEXT812(0);
    auVar20._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar20,0);
    bVar7 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar7 * -0x80000000 + (uint)!bVar7 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  auVar21 = vmovshdup_avx(auVar15._0_16_);
  fVar6 = auVar21._0_4_ + c1;
  local_d8 = ZEXT416((uint)fVar6);
  if (fVar6 < INFINITY) {
    uVar2 = vcmpss_avx512f(local_d8,ZEXT816(0) << 0x20,0);
    fVar6 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar6);
    local_d8 = ZEXT416((-(uint)(fVar6 < 0.0) | 1) + (int)fVar6);
  }
  local_40.low = c5;
  local_40.high = c5;
  auVar16._0_8_ = Interval::operator*(&local_40,tInterval);
  auVar16._8_56_ = extraout_var_03;
  fVar6 = auVar16._0_4_ + c4;
  if (-INFINITY < fVar6) {
    auVar22._0_12_ = ZEXT812(0);
    auVar22._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar6),auVar22,0);
    bVar7 = (bool)((byte)uVar2 & 1);
    fVar6 = (float)((uint)bVar7 * -0x80000000 + (uint)!bVar7 * (int)fVar6);
    fVar6 = (float)((int)fVar6 + -1 + (uint)(fVar6 <= 0.0) * 2);
  }
  auVar21 = vminss_avx(local_d8,ZEXT416((uint)fVar8));
  auVar20 = vmovshdup_avx(auVar16._0_16_);
  fVar9 = auVar20._0_4_ + c4;
  if (fVar9 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),ZEXT816(0) << 0x20,0);
    fVar9 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar9);
    fVar9 = (float)((-(uint)(fVar9 < 0.0) | 1) + (int)fVar9);
  }
  auVar22 = vmaxss_avx(local_d8,ZEXT416((uint)fVar8));
  auVar23 = vminss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar6));
  auVar20 = vmaxss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar6));
  auVar20 = vinsertps_avx(auVar23,auVar20,0x10);
  local_58 = (Interval)vmovlps_avx(auVar20);
  local_48.low = fVar5;
  local_48.high = fVar5;
  IVar13 = Interval::operator*(&local_48,tInterval);
  IVar13 = Sin(IVar13);
  auVar17._0_8_ = Interval::operator*(&local_58,IVar13);
  auVar17._8_56_ = extraout_var_04;
  fVar8 = auVar17._0_4_ + auVar21._0_4_;
  if (-INFINITY < fVar8) {
    auVar23._0_12_ = ZEXT812(0);
    auVar23._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar23,0);
    bVar7 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar7 * -0x80000000 + (uint)!bVar7 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  auVar21 = vmovshdup_avx(auVar17._0_16_);
  fVar6 = auVar21._0_4_ + auVar22._0_4_;
  if (fVar6 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar6),ZEXT816(0) << 0x40,0);
    fVar6 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar6);
    fVar6 = (float)((-(uint)(fVar6 < 0.0) | 1) + (int)fVar6);
  }
  auVar21 = vminss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar8));
  fVar9 = auVar21._0_4_;
  if (fVar9 <= 0.0) {
    auVar21 = vmaxss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar8));
    fVar8 = auVar21._0_4_;
    if (0.0 <= fVar8) {
      if ((fVar9 != fVar8) || (NAN(fVar9) || NAN(fVar8))) {
        if (((int)nZeros < 1) || (fVar8 - fVar9 <= 0.001)) {
          auVar4._8_8_ = in_XMM6_Qb;
          auVar4._0_8_ = tInterval;
          auVar21 = vmovshdup_avx(auVar4);
          fVar8 = (local_98 + auVar21._0_4_) * 0.5;
          iVar11 = 3;
          do {
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)c3),ZEXT416((uint)c2));
            auVar18._0_4_ = cosf(fVar8 * fVar5);
            auVar18._4_60_ = extraout_var;
            auVar22 = vfmadd213ss_fma(auVar18._0_16_,auVar20,ZEXT416((uint)c1));
            auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)c5),ZEXT416((uint)c4));
            auVar19._0_4_ = sinf(fVar8 * fVar5);
            auVar19._4_60_ = extraout_var_00;
            auVar22 = vfmadd213ss_fma(auVar19._0_16_,auVar23,ZEXT416(auVar22._0_4_));
            auVar23 = vfmadd213ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar23._0_4_)),
                                      ZEXT416((uint)theta),ZEXT416((uint)c3));
            fVar6 = (fVar8 + fVar8) * theta;
            fVar9 = cosf(fVar6);
            local_d8._0_4_ = auVar20._0_4_;
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)((float)local_d8._0_4_ * -2.0)),
                                      ZEXT416((uint)theta),ZEXT416((uint)c5));
            fVar6 = sinf(fVar6);
            auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * auVar20._0_4_)),ZEXT416((uint)fVar9),
                                      ZEXT416(auVar23._0_4_));
            uVar2 = vcmpps_avx512vl(auVar22,ZEXT816(0),0);
            uVar1 = vcmpps_avx512vl(auVar20,ZEXT816(0),0);
            bVar7 = (bool)(((byte)uVar2 | (byte)uVar1) & 1);
            fVar8 = (float)((uint)bVar7 * (int)fVar8 +
                           (uint)!bVar7 * (int)(fVar8 - auVar22._0_4_ / auVar20._0_4_));
            bVar12 = iVar11 != 0;
            iVar11 = iVar11 + -1;
            if (bVar7 != false) break;
          } while (bVar12);
          if ((local_98 + -0.001 <= fVar8) && (fVar8 < auVar21._0_4_ + 0.001)) {
            iVar11 = *(int *)zeros.n;
            (this->startTransform).m.m[0][iVar11] = fVar8;
            *(int *)zeros.n = iVar11 + 1;
          }
        }
        else {
          auVar3._8_8_ = in_XMM6_Qb;
          auVar3._0_8_ = tInterval;
          auVar22 = vmovshdup_avx(auVar3);
          fVar5 = (local_98 + auVar22._0_4_) * 0.5;
          auVar20 = vminss_avx(ZEXT416((uint)fVar5),auVar3);
          auVar21 = vmaxss_avx(ZEXT416((uint)fVar5),auVar3);
          auVar21 = vinsertps_avx(auVar20,auVar21,0x10);
          uVar10 = (int)nZeros - 1;
          FindZeros(this,c1,c2,c3,c4,c5,theta,auVar21._0_8_,zeros,(int *)(ulong)uVar10,depth);
          auVar20 = vminss_avx(auVar22,ZEXT416((uint)fVar5));
          auVar21 = vmaxss_avx(auVar22,ZEXT416((uint)fVar5));
          auVar21 = vinsertps_avx(auVar20,auVar21,0x10);
          FindZeros(this,c1,c2,c3,c4,c5,theta,auVar21._0_8_,zeros,(int *)(ulong)uVar10,depth);
        }
      }
    }
  }
  return;
}

Assistant:

void AnimatedTransform::FindZeros(Float c1, Float c2, Float c3, Float c4, Float c5,
                                  Float theta, Interval tInterval,
                                  pstd::span<Float> zeros, int *nZeros, int depth) {
    // Evaluate motion derivative in interval form, return if no zeros
    Interval dadt =
        Interval(c1) +
        (Interval(c2) + Interval(c3) * tInterval) * Cos(Interval(2 * theta) * tInterval) +
        (Interval(c4) + Interval(c5) * tInterval) * Sin(Interval(2 * theta) * tInterval);
    if (dadt.LowerBound() > 0 || dadt.UpperBound() < 0 ||
        dadt.LowerBound() == dadt.UpperBound())
        return;

    // Either split range and recurse or report a zero
    if (depth > 0 && dadt.Width() > 1e-3) {
        // Split _tInterval_ and check both resulting intervals
        Float mid = tInterval.Midpoint();
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(tInterval.LowerBound(), mid), zeros,
                  nZeros, depth - 1);
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(mid, tInterval.UpperBound()), zeros,
                  nZeros, depth - 1);

    } else {
        // Use Newton's method to refine zero
        Float tNewton = tInterval.Midpoint();
        for (int i = 0; i < 4; ++i) {
            // Evaluate motion function derivative and its derivative at _tNewton_
            Float fNewton = c1 + (c2 + c3 * tNewton) * std::cos(2 * theta * tNewton) +
                            (c4 + c5 * tNewton) * std::sin(2 * theta * tNewton);
            Float fPrimeNewton =
                (c3 + 2 * (c4 + c5 * tNewton) * theta) * std::cos(2 * tNewton * theta) +
                (c5 - 2 * (c2 + c3 * tNewton) * theta) * std::sin(2 * tNewton * theta);

            if (fNewton == 0 || fPrimeNewton == 0)
                break;
            tNewton = tNewton - fNewton / fPrimeNewton;
        }

        // Record zero if refined zero is in interval
        if (tNewton >= tInterval.LowerBound() - 1e-3f &&
            tNewton < tInterval.UpperBound() + 1e-3f) {
            zeros[*nZeros] = tNewton;
            (*nZeros)++;
        }
    }
}